

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O1

size_t ZSTD_compressBlock_opt2
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize,
                 ZSTD_dictMode_e dictMode)

{
  ZSTD_optimal_t *pZVar1;
  ZSTD_optimal_t *pZVar2;
  rawSeqStore_t *prVar3;
  undefined8 uVar4;
  seqDef *psVar5;
  uint uVar6;
  int iVar7;
  U32 UVar8;
  U32 UVar9;
  ZSTD_match_t *matches;
  optState_t *optPtr;
  U32 i;
  U32 UVar10;
  U32 UVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  ZSTD_optimal_t *pZVar15;
  U32 *pUVar16;
  int iVar17;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  ulong uVar22;
  BYTE *pBVar23;
  BYTE *literals;
  uint uVar24;
  BYTE *pBVar25;
  uint uVar26;
  BYTE *pBVar27;
  uint uVar28;
  uint uVar29;
  ulong uVar30;
  bool bVar31;
  U32 nbMatches;
  U32 UStack_144;
  U32 local_140 [2];
  ZSTD_optimal_t *local_138;
  ulong local_130;
  BYTE *local_128;
  ZSTD_match_t *local_120;
  BYTE *local_118;
  BYTE *local_110;
  optState_t *local_108;
  uint local_fc;
  BYTE *local_f8;
  BYTE *local_f0;
  ulong local_e8;
  ulong local_e0;
  ulong local_d8;
  U32 *local_d0;
  int local_c8;
  U32 nextToUpdate3;
  BYTE *local_c0;
  ZSTD_optimal_t *local_b8;
  BYTE *local_b0;
  ulong local_a8;
  undefined8 local_a0;
  U32 local_98;
  ZSTD_getAllMatchesFn local_90;
  ZSTD_optimal_t *local_88;
  seqStore_t *local_80;
  ulong local_78;
  BYTE *local_70;
  ZSTD_optLdm_t local_68;
  
  local_108 = &ms->opt;
  local_b0 = (BYTE *)((long)src + (srcSize - 8));
  uVar12 = (ms->window).dictLimit;
  pBVar25 = (ms->window).base;
  local_d0 = rep;
  local_c0 = (BYTE *)src;
  local_80 = seqStore;
  local_90 = ZSTD_selectBtGetAllMatches(ms,dictMode);
  local_f8 = local_c0;
  uVar19 = (ms->cParams).targetLength;
  local_fc = 0xfff;
  if (uVar19 < 0xfff) {
    local_fc = uVar19;
  }
  local_138 = (ZSTD_optimal_t *)CONCAT71(local_138._1_7_,(ms->cParams).minMatch != 3);
  nextToUpdate3 = ms->nextToUpdate;
  local_120 = (ms->opt).matchTable;
  pZVar2 = (ms->opt).priceTable;
  local_a0 = 0;
  local_98 = 0;
  prVar3 = ms->ldmSeqStore;
  if (prVar3 == (rawSeqStore_t *)0x0) {
    local_68.seqStore.posInSequence = 0;
    local_68.seqStore.size = 0;
    local_68.seqStore.seq = (rawSeq *)0x0;
    local_68.seqStore.pos = 0;
    local_68.seqStore.capacity = 0;
  }
  else {
    local_68.seqStore.capacity = prVar3->capacity;
    local_68.seqStore.seq = prVar3->seq;
    local_68.seqStore.pos = prVar3->pos;
    local_68.seqStore.posInSequence = prVar3->posInSequence;
    local_68.seqStore.size = prVar3->size;
  }
  pBVar23 = local_c0 + srcSize;
  local_68.offset = 0;
  local_68.startPosInBlock = 0;
  local_68.endPosInBlock = 0;
  ZSTD_opt_getNextMatchAndUpdateSeqStore(&local_68,0,(U32)srcSize);
  ZSTD_rescaleFreqs(local_108,local_f8,srcSize,2);
  pBVar25 = local_f8 + (pBVar25 + uVar12 == local_f8);
  if (pBVar25 < local_b0) {
    local_a8 = (ulong)((byte)local_138 + 3);
    local_70 = pBVar23 + -0x20;
    local_78 = (ulong)((byte)local_138 + 3);
    local_138 = pZVar2 + 1;
    local_c8 = 0;
    local_e8 = 0;
    local_e0 = 0;
    local_d8 = 0;
    local_f0 = pBVar23;
    local_88 = local_138;
    do {
      matches = local_120;
      iVar17 = (int)pBVar25;
      local_130 = (ulong)(uint)(iVar17 - (int)local_f8);
      nbMatches = (*local_90)(local_120,ms,&nextToUpdate3,pBVar25,pBVar23,local_d0,
                              SUB14(iVar17 - (int)local_f8 == 0,0),(U32)local_a8);
      ZSTD_optLdm_processMatchCandidate
                (&local_68,matches,&nbMatches,iVar17 - (int)local_c0,(int)pBVar23 - iVar17);
      uVar30 = local_130;
      local_128 = (BYTE *)(ulong)nbMatches;
      if (nbMatches == 0) {
        pBVar25 = pBVar25 + 1;
        uVar22 = 0;
        iVar17 = 2;
      }
      else {
        lVar14 = 0;
        do {
          pZVar2->rep[lVar14] = local_d0[lVar14];
          lVar14 = lVar14 + 1;
        } while (lVar14 != 3);
        pZVar2->mlen = 0;
        UVar11 = (U32)local_130;
        pZVar2->litlen = UVar11;
        local_118 = pBVar25;
        UVar10 = ZSTD_litLengthPrice(UVar11,local_108,2);
        pZVar2->price = UVar10;
        uVar19 = (int)local_128 - 1;
        uVar12 = local_120[uVar19].len;
        if (local_fc < uVar12) {
          local_e8 = (ulong)local_120[uVar19].off;
          uVar22 = (ulong)(uVar12 + UVar11);
          local_138 = (ZSTD_optimal_t *)0x0;
          iVar17 = 7;
          local_d8 = (ulong)uVar12;
          local_e0 = uVar30 & 0xffffffff;
          pBVar25 = local_118;
        }
        else {
          if ((int)UVar10 < 0) {
            __assert_fail("opt[0].price >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                          ,0x477,
                          "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                         );
          }
          UVar11 = ZSTD_litLengthPrice(0,local_108,2);
          uVar22 = 1;
          pZVar15 = local_88;
          do {
            pZVar15->price = 0x40000000;
            uVar22 = uVar22 + 1;
            pZVar15 = pZVar15 + 1;
          } while (local_78 != uVar22);
          local_128 = (BYTE *)(ulong)((int)local_128 + (uint)((int)local_128 == 0));
          pBVar25 = (BYTE *)0x0;
          do {
            uVar12 = local_120[(long)pBVar25].len;
            local_110 = pBVar25;
            if ((uint)uVar22 <= uVar12) {
              uVar19 = local_120[(long)pBVar25].off;
              if (uVar19 == 0) {
LAB_0020d6a6:
                __assert_fail("val != 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/bits.h"
                              ,0xab,"unsigned int ZSTD_highbit32(U32)");
              }
              uVar21 = 0x1f;
              if (uVar19 != 0) {
                for (; uVar19 >> uVar21 == 0; uVar21 = uVar21 - 1) {
                }
              }
              uVar24 = (uint)uVar22 * 0x100 - 0x200;
              do {
                uVar13 = (uint)uVar22;
                if (uVar13 < 3) {
LAB_0020d6c5:
                  __assert_fail("matchLength >= MINMATCH",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                                ,0x148,
                                "U32 ZSTD_getMatchPrice(const U32, const U32, const optState_t *const, const int)"
                               );
                }
                if ((ms->opt).priceType == zop_predef) {
                  uVar20 = 0x1f;
                  if (uVar13 - 2 != 0) {
                    for (; uVar13 - 2 >> uVar20 == 0; uVar20 = uVar20 - 1) {
                    }
                  }
                  if (0x16 < uVar20) goto LAB_0020d687;
                  iVar17 = (uVar20 + uVar21) * 0x100 + (uVar24 >> ((byte)uVar20 & 0x1f)) + 0x1000;
                }
                else {
                  uVar20 = (ms->opt).offCodeFreq[uVar21] + 1;
                  if (uVar20 == 0) goto LAB_0020d6a6;
                  uVar26 = 0x1f;
                  if (uVar20 != 0) {
                    for (; uVar20 >> uVar26 == 0; uVar26 = uVar26 - 1) {
                    }
                  }
                  if (0x16 < uVar26) {
LAB_0020d687:
                    __assert_fail("hb + BITCOST_ACCURACY < 31",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                                  ,0x3c,"U32 ZSTD_fracWeight(U32)");
                  }
                  uVar28 = uVar13 - 3;
                  if (uVar28 < 0x80) {
                    uVar28 = (uint)(byte)(&ZSTD_MLcode_ML_Code)[uVar28];
                  }
                  else {
                    uVar29 = 0x1f;
                    if (uVar28 != 0) {
                      for (; uVar28 >> uVar29 == 0; uVar29 = uVar29 - 1) {
                      }
                    }
                    uVar28 = (uVar29 ^ 0xffffffe0) + 0x44;
                  }
                  uVar29 = (ms->opt).matchLengthFreq[uVar28] + 1;
                  if (uVar29 == 0) goto LAB_0020d6a6;
                  uVar6 = 0x1f;
                  if (uVar29 != 0) {
                    for (; uVar29 >> uVar6 == 0; uVar6 = uVar6 - 1) {
                    }
                  }
                  if (0x16 < uVar6) goto LAB_0020d687;
                  iVar17 = (((ms->opt).matchLengthSumBasePrice + (ms->opt).offCodeSumBasePrice) -
                           ((uVar20 * 0x100 >> ((byte)uVar26 & 0x1f)) +
                           (uVar29 * 0x100 >> ((byte)uVar6 & 0x1f)))) +
                           ((""[uVar28] + uVar21) - (uVar26 + uVar6)) * 0x100 + 0x33;
                  uVar30 = local_130;
                }
                uVar22 = uVar22 & 0xffffffff;
                pZVar2[uVar22].mlen = uVar13;
                pZVar2[uVar22].off = uVar19;
                pZVar2[uVar22].litlen = (U32)uVar30;
                pZVar2[uVar22].price = iVar17 + UVar11 + UVar10;
                uVar22 = (ulong)(uVar13 + 1);
                uVar24 = uVar24 + 0x100;
              } while (uVar13 + 1 <= uVar12);
            }
            pBVar25 = pBVar25 + 1;
          } while (pBVar25 != local_128);
          uVar22 = (ulong)((int)uVar22 - 1);
          iVar17 = 0;
          pBVar25 = local_118;
        }
      }
      pZVar15 = local_138;
      uVar30 = local_e8;
      if (iVar17 == 7) {
LAB_0020d29d:
        if (pZVar2->mlen != 0) {
          __assert_fail("opt[0].mlen == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                        ,0x507,
                        "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                       );
        }
        local_138 = pZVar15;
        uVar22 = (ulong)pZVar15 & 0xffffffff;
        uVar12 = (uint)uVar30;
        if ((U32)local_d8 == 0) {
          local_d0[2] = pZVar2[uVar22].rep[2];
          *(undefined8 *)local_d0 = *(undefined8 *)pZVar2[uVar22].rep;
        }
        else {
          local_140[0] = pZVar2[uVar22].rep[2];
          uVar4 = *(undefined8 *)pZVar2[uVar22].rep;
          nbMatches = (U32)uVar4;
          UStack_144 = (U32)((ulong)uVar4 >> 0x20);
          if (uVar12 < 4) {
            if (uVar12 == 0) {
LAB_0020d858:
              __assert_fail("OFFBASE_IS_REPCODE(offBase)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                            ,0x2d5,"void ZSTD_updateRep(U32 *, const U32, const U32)");
            }
            uVar19 = (((U32)local_e0 == 0) + uVar12) - 1;
            UVar10 = nbMatches;
            UVar11 = UStack_144;
            if (uVar19 != 0) {
              if (uVar19 == 3) {
                UVar10 = nbMatches - 1;
              }
              else {
                UVar10 = (&nbMatches)[uVar19];
              }
              pUVar16 = &UStack_144;
              if (uVar19 == 1) {
                pUVar16 = local_140;
              }
              local_140[0] = *pUVar16;
              UStack_144 = nbMatches;
              UVar11 = UStack_144;
            }
          }
          else {
            UVar10 = uVar12 - 3;
            UVar11 = nbMatches;
            local_140[0] = UStack_144;
          }
          UStack_144 = UVar11;
          nbMatches = UVar10;
          *(ulong *)local_d0 = CONCAT44(UStack_144,nbMatches);
          local_d0[2] = local_140[0];
        }
        iVar17 = (int)pZVar15;
        uVar19 = iVar17 + 1;
        if (0xfff < uVar19) {
          __assert_fail("storeEnd < ZSTD_OPT_NUM",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                        ,0x51a,
                        "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                       );
        }
        local_128 = (BYTE *)(ulong)uVar19;
        pZVar2[(long)local_128].price = local_c8;
        pZVar2[(long)local_128].off = uVar12;
        pZVar2[(long)local_128].mlen = (U32)local_d8;
        pZVar2[(long)local_128].litlen = (U32)local_e0;
        *(undefined8 *)pZVar2[(long)local_128].rep = local_a0;
        pZVar2[(long)local_128].rep[2] = local_98;
        uVar18 = (ulong)pZVar15 & 0xffffffff;
        uVar22 = (ulong)pZVar15 & 0xffffffff;
        uVar12 = uVar19;
        if (iVar17 != 0) {
          do {
            uVar21 = (uint)uVar22;
            uVar24 = pZVar2[uVar22].litlen + pZVar2[uVar22].mlen;
            uVar12 = (uint)uVar18;
            pZVar15 = pZVar2 + uVar22;
            iVar7 = pZVar15->price;
            UVar11 = pZVar15->off;
            UVar8 = pZVar15->mlen;
            UVar9 = pZVar15->litlen;
            pZVar15 = pZVar2 + uVar22;
            UVar10 = pZVar15->rep[0];
            uVar4 = *(undefined8 *)(&pZVar15->litlen + 2);
            pZVar1 = pZVar2 + uVar18;
            pZVar1->litlen = pZVar15->litlen;
            pZVar1->rep[0] = UVar10;
            *(undefined8 *)(&pZVar1->litlen + 2) = uVar4;
            pZVar15 = pZVar2 + uVar18;
            pZVar15->price = iVar7;
            pZVar15->off = UVar11;
            pZVar15->mlen = UVar8;
            pZVar15->litlen = UVar9;
            uVar18 = (ulong)(uVar12 - 1);
            uVar22 = (ulong)(uVar21 - uVar24);
            if (uVar24 > uVar21) {
              uVar22 = 0;
            }
          } while (uVar24 <= uVar21 && uVar21 - uVar24 != 0);
        }
        pBVar23 = local_f0;
        literals = local_f8;
        local_e8 = uVar30;
        if (uVar12 <= uVar19) {
          pBVar27 = (BYTE *)(ulong)uVar12;
          local_110 = (BYTE *)(ulong)(iVar17 + 2);
          do {
            uVar12 = pZVar2[(long)pBVar27].litlen;
            uVar19 = pZVar2[(long)pBVar27].mlen;
            if ((ulong)uVar19 == 0) {
              if (pBVar27 != local_128) {
                __assert_fail("storePos == storeEnd",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                              ,0x533,
                              "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                             );
              }
              pBVar25 = literals + uVar12;
            }
            else {
              pBVar25 = literals + uVar12;
              if (pBVar23 < pBVar25) {
                __assert_fail("anchor + llen <= iend",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                              ,0x538,
                              "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                             );
              }
              local_118 = (BYTE *)CONCAT44(local_118._4_4_,pZVar2[(long)pBVar27].off);
              local_130 = (ulong)uVar19;
              ZSTD_updateStats(local_108,uVar12,literals,pZVar2[(long)pBVar27].off,uVar19);
              if (local_80->maxNbSeq <=
                  (ulong)((long)local_80->sequences - (long)local_80->sequencesStart >> 3)) {
                __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                              ,0x29d,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              if (0x20000 < local_80->maxNbLit) {
                __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                              ,0x29f,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              pBVar23 = local_80->lit;
              if (local_80->litStart + local_80->maxNbLit < pBVar23 + uVar12) {
                __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                              ,0x2a0,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              if (local_70 < pBVar25) {
                ZSTD_safecopyLiterals(pBVar23,literals,pBVar25,local_70);
              }
              else {
                uVar4 = *(undefined8 *)(literals + 8);
                *(undefined8 *)pBVar23 = *(undefined8 *)literals;
                *(undefined8 *)(pBVar23 + 8) = uVar4;
                if (0x10 < uVar12) {
                  pBVar25 = local_80->lit;
                  if ((BYTE *)0xffffffffffffffe0 <
                      pBVar25 + 0x10 + (-0x10 - (long)(literals + 0x10))) {
                    __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/zstd_internal.h"
                                  ,0xe9,
                                  "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                                 );
                  }
                  uVar4 = *(undefined8 *)(literals + 0x18);
                  *(undefined8 *)(pBVar25 + 0x10) = *(undefined8 *)(literals + 0x10);
                  *(undefined8 *)(pBVar25 + 0x18) = uVar4;
                  if (0x20 < uVar12) {
                    lVar14 = 0;
                    do {
                      uVar4 = *(undefined8 *)(literals + lVar14 + 0x20 + 8);
                      pBVar23 = pBVar25 + lVar14 + 0x20;
                      *(undefined8 *)pBVar23 = *(undefined8 *)(literals + lVar14 + 0x20);
                      *(undefined8 *)(pBVar23 + 8) = uVar4;
                      uVar4 = *(undefined8 *)(literals + lVar14 + 0x30 + 8);
                      *(undefined8 *)(pBVar23 + 0x10) = *(undefined8 *)(literals + lVar14 + 0x30);
                      *(undefined8 *)(pBVar23 + 0x18) = uVar4;
                      lVar14 = lVar14 + 0x20;
                    } while (pBVar23 + 0x20 < pBVar25 + uVar12);
                  }
                }
              }
              local_80->lit = local_80->lit + uVar12;
              if (0xffff < uVar12) {
                if (local_80->longLengthType != ZSTD_llt_none) {
                  __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                                ,0x2b2,
                                "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                               );
                }
                local_80->longLengthType = ZSTD_llt_literalLength;
                local_80->longLengthPos =
                     (U32)((ulong)((long)local_80->sequences - (long)local_80->sequencesStart) >> 3)
                ;
              }
              psVar5 = local_80->sequences;
              psVar5->litLength = (U16)uVar12;
              psVar5->offBase = (U32)local_118;
              if ((uint)local_130 < 3) {
                __assert_fail("matchLength >= MINMATCH",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                              ,700,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              if (0xffff < local_130 - 3) {
                if (local_80->longLengthType != ZSTD_llt_none) {
                  __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                                ,0x2bf,
                                "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                               );
                }
                local_80->longLengthType = ZSTD_llt_matchLength;
                local_80->longLengthPos =
                     (U32)((ulong)((long)psVar5 - (long)local_80->sequencesStart) >> 3);
              }
              psVar5->mlBase = (U16)(local_130 - 3);
              local_80->sequences = psVar5 + 1;
              literals = literals + ((uint)local_130 + uVar12);
              pBVar23 = local_f0;
              pBVar25 = literals;
            }
            pBVar27 = pBVar27 + 1;
          } while (pBVar27 != local_110);
        }
        local_f8 = literals;
        ZSTD_setBasePrices(local_108,2);
      }
      else {
        pBVar23 = local_f0;
        if (iVar17 == 0) {
          if ((int)uVar22 != 0) {
            pZVar15 = (ZSTD_optimal_t *)0x1;
            local_118 = pBVar25;
            do {
              optPtr = local_108;
              if (0xfff < (uint)pZVar15) {
                __assert_fail("cur < ZSTD_OPT_NUM",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                              ,0x492,
                              "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                             );
              }
              uVar12 = (uint)pZVar15 - 1;
              local_b8 = pZVar2 + uVar12;
              uVar30 = 1;
              if (pZVar2[uVar12].mlen == 0) {
                uVar30 = (ulong)(local_b8->litlen + 1);
              }
              local_110 = local_118 + (long)pZVar15;
              local_130 = CONCAT44(local_130._4_4_,local_b8->price);
              local_138 = pZVar15;
              UVar10 = ZSTD_rawLiteralsCost
                                 (local_110 + -1,(U32)local_108,(optState_t *)0x2,local_b8->price);
              local_128 = (BYTE *)CONCAT44(local_128._4_4_,UVar10);
              UVar10 = ZSTD_litLengthPrice((U32)uVar30,optPtr,2);
              iVar17 = UVar10 + (int)local_128 + (U32)local_130;
              local_130 = uVar30;
              UVar10 = ZSTD_litLengthPrice((U32)uVar30 - 1,optPtr,2);
              uVar30 = local_130;
              iVar17 = iVar17 - UVar10;
              if (999999999 < iVar17) {
                __assert_fail("price < 1000000000",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                              ,0x49b,
                              "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                             );
              }
              pZVar1 = pZVar2 + (long)pZVar15;
              if (iVar17 <= pZVar2[(long)pZVar15].price) {
                pZVar1->off = 0;
                pZVar1->mlen = 0;
                pZVar1->litlen = (U32)local_130;
                pZVar1->price = iVar17;
              }
              uVar12 = pZVar1->mlen;
              uVar19 = (uint)local_138;
              if (uVar19 < uVar12) {
                __assert_fail("cur >= opt[cur].mlen",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                              ,0x4b1,
                              "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                             );
              }
              if (uVar12 == 0) {
                pZVar1->rep[2] = local_b8->rep[2];
                *(undefined8 *)pZVar1->rep = *(undefined8 *)local_b8->rep;
              }
              else {
                uVar21 = pZVar1->off;
                local_140[0] = pZVar2[uVar19 - uVar12].rep[2];
                nbMatches = (U32)*(undefined8 *)pZVar2[uVar19 - uVar12].rep;
                UStack_144 = (U32)((ulong)*(undefined8 *)pZVar2[uVar19 - uVar12].rep >> 0x20);
                if (uVar21 < 4) {
                  if (uVar21 == 0) goto LAB_0020d858;
                  uVar12 = (uVar21 + (pZVar1->litlen == 0)) - 1;
                  UVar10 = nbMatches;
                  UVar11 = UStack_144;
                  if (uVar12 != 0) {
                    if (uVar12 == 3) {
                      UVar10 = nbMatches - 1;
                    }
                    else {
                      UVar10 = (&nbMatches)[uVar12];
                    }
                    pUVar16 = &UStack_144;
                    if (uVar12 == 1) {
                      pUVar16 = local_140;
                    }
                    local_140[0] = *pUVar16;
                    UStack_144 = nbMatches;
                    UVar11 = UStack_144;
                  }
                }
                else {
                  UVar10 = uVar21 - 3;
                  UVar11 = nbMatches;
                  local_140[0] = UStack_144;
                }
                UStack_144 = UVar11;
                nbMatches = UVar10;
                *(ulong *)pZVar1->rep = CONCAT44(UStack_144,nbMatches);
                pZVar1->rep[2] = local_140[0];
              }
              uVar12 = 0x13;
              if ((local_110 <= local_b0) && (uVar12 = 0x11, uVar19 != (uint)uVar22)) {
                if (pZVar1->price < 0) {
                  __assert_fail("opt[cur].price >= 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                                ,0x4c5,
                                "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                               );
                }
                local_b8 = (ZSTD_optimal_t *)CONCAT44(local_b8._4_4_,pZVar1->price);
                local_130 = local_130 & 0xffffffff00000000;
                bVar31 = pZVar1->mlen != 0;
                if (!bVar31) {
                  local_130._4_4_ = SUB84(uVar30,4);
                  local_130 = CONCAT44(local_130._4_4_,pZVar1->litlen);
                }
                local_128 = (BYTE *)(ulong)bVar31;
                UVar10 = ZSTD_litLengthPrice(0,local_108,2);
                pBVar25 = local_110;
                nbMatches = (*local_90)(local_120,ms,&nextToUpdate3,local_110,local_f0,pZVar1->rep,
                                        (U32)local_128,(U32)local_a8);
                ZSTD_optLdm_processMatchCandidate
                          (&local_68,local_120,&nbMatches,(int)pBVar25 - (int)local_c0,
                           (int)local_f0 - (int)pBVar25);
                if (nbMatches == 0) {
                  uVar12 = 0x13;
                }
                else {
                  uVar19 = local_120[nbMatches - 1].len;
                  bVar31 = 0xfff < (int)local_138 + uVar19;
                  uVar12 = 0;
                  if (bVar31 || local_fc < uVar19) {
                    UVar11 = 0;
                    if (pZVar1->mlen == 0) {
                      UVar11 = pZVar1->litlen;
                    }
                    uVar12 = (int)local_138 - UVar11;
                    uVar22 = (ulong)(uVar19 + (U32)local_130 + uVar12);
                    if (0x1000 < uVar12) {
                      uVar12 = 0;
                    }
                    local_138 = (ZSTD_optimal_t *)(ulong)uVar12;
                    local_e8 = (ulong)local_120[nbMatches - 1].off;
                    uVar12 = 7;
                    local_d8 = (ulong)uVar19;
                    local_e0 = local_130 & 0xffffffff;
                  }
                  if (!bVar31 && local_fc >= uVar19) {
                    local_128 = (BYTE *)(ulong)(nbMatches + (nbMatches == 0));
                    pBVar25 = (BYTE *)0x0;
                    do {
                      uVar12 = (uint)local_a8;
                      if (pBVar25 != (BYTE *)0x0) {
                        uVar12 = local_120[(long)(pBVar25 + -1)].len + 1;
                      }
                      uVar30 = (ulong)local_120[(long)pBVar25].len;
                      local_110 = pBVar25;
                      if (uVar12 <= local_120[(long)pBVar25].len) {
                        uVar19 = local_120[(long)pBVar25].off;
                        if (uVar19 == 0) goto LAB_0020d6a6;
                        uVar21 = 0x1f;
                        if (uVar19 != 0) {
                          for (; uVar19 >> uVar21 == 0; uVar21 = uVar21 - 1) {
                          }
                        }
                        do {
                          if (uVar30 < 3) goto LAB_0020d6c5;
                          UVar11 = (U32)uVar30;
                          if ((ms->opt).priceType == zop_predef) {
                            uVar13 = UVar11 - 2;
                            uVar24 = 0x1f;
                            if (uVar13 != 0) {
                              for (; uVar13 >> uVar24 == 0; uVar24 = uVar24 - 1) {
                              }
                            }
                            if (0x16 < uVar24) goto LAB_0020d687;
                            iVar17 = (uVar13 * 0x100 >> ((byte)uVar24 & 0x1f)) +
                                     (uVar24 + uVar21) * 0x100 + 0x1000;
                          }
                          else {
                            uVar24 = (ms->opt).offCodeFreq[uVar21] + 1;
                            if (uVar24 == 0) goto LAB_0020d6a6;
                            uVar13 = 0x1f;
                            if (uVar24 != 0) {
                              for (; uVar24 >> uVar13 == 0; uVar13 = uVar13 - 1) {
                              }
                            }
                            if (0x16 < uVar13) goto LAB_0020d687;
                            uVar20 = UVar11 - 3;
                            if (uVar20 < 0x80) {
                              uVar20 = (uint)(byte)(&ZSTD_MLcode_ML_Code)[uVar20];
                            }
                            else {
                              uVar26 = 0x1f;
                              if (uVar20 != 0) {
                                for (; uVar20 >> uVar26 == 0; uVar26 = uVar26 - 1) {
                                }
                              }
                              uVar20 = (uVar26 ^ 0xffffffe0) + 0x44;
                            }
                            uVar26 = (ms->opt).matchLengthFreq[uVar20] + 1;
                            if (uVar26 == 0) goto LAB_0020d6a6;
                            uVar28 = 0x1f;
                            if (uVar26 != 0) {
                              for (; uVar26 >> uVar28 == 0; uVar28 = uVar28 - 1) {
                              }
                            }
                            if (0x16 < uVar28) goto LAB_0020d687;
                            iVar17 = (((ms->opt).matchLengthSumBasePrice +
                                      (ms->opt).offCodeSumBasePrice) -
                                     ((uVar24 * 0x100 >> ((byte)uVar13 & 0x1f)) +
                                     (uVar26 * 0x100 >> ((byte)uVar28 & 0x1f)))) +
                                     ((""[uVar20] + uVar21) - (uVar13 + uVar28)) * 0x100 + 0x33;
                          }
                          iVar17 = iVar17 + UVar10 + (int)local_b8;
                          uVar24 = (int)local_138 + UVar11;
                          uVar18 = (ulong)uVar24;
                          if (((uint)uVar22 < uVar24) || (iVar17 < pZVar2[uVar18].price)) {
                            if ((uint)uVar22 < uVar24) {
                              uVar22 = uVar22 & 0xffffffff;
                              pZVar15 = local_88 + uVar22;
                              do {
                                uVar22 = uVar22 + 1;
                                pZVar15->price = 0x40000000;
                                pZVar15 = pZVar15 + 1;
                              } while (uVar22 < uVar18);
                            }
                            pZVar2[uVar18].mlen = UVar11;
                            pZVar2[uVar18].off = uVar19;
                            pZVar2[uVar18].litlen = (U32)local_130;
                            pZVar2[uVar18].price = iVar17;
                          }
                          uVar30 = uVar30 - 1;
                        } while (uVar12 <= (uint)uVar30);
                      }
                      pBVar25 = pBVar25 + 1;
                    } while (pBVar25 != local_128);
                    uVar12 = 0;
                  }
                }
              }
              pBVar23 = local_f0;
              pBVar25 = local_118;
              if (uVar12 < 0x11) {
                if (uVar12 != 0) {
                  pZVar15 = local_138;
                  uVar30 = local_e8;
                  if (uVar12 == 7) goto LAB_0020d29d;
                  goto LAB_0020d658;
                }
              }
              else if (uVar12 != 0x13) {
                if (uVar12 != 0x11) goto LAB_0020d658;
                break;
              }
              uVar12 = (int)local_138 + 1;
              pZVar15 = (ZSTD_optimal_t *)(ulong)uVar12;
            } while (uVar12 <= (uint)uVar22);
          }
          uVar30 = uVar22 & 0xffffffff;
          local_c8 = pZVar2[uVar30].price;
          local_98 = pZVar2[uVar30].rep[2];
          local_a0 = *(undefined8 *)pZVar2[uVar30].rep;
          local_d8 = (ulong)pZVar2[uVar30].mlen;
          local_e0 = (ulong)pZVar2[uVar30].litlen;
          uVar12 = pZVar2[uVar30].litlen + pZVar2[uVar30].mlen;
          pZVar15 = (ZSTD_optimal_t *)(ulong)((uint)uVar22 - uVar12);
          if ((uint)uVar22 < uVar12) {
            pZVar15 = (ZSTD_optimal_t *)0x0;
          }
          uVar30 = (ulong)pZVar2[uVar30].off;
          if (0xfff < (uint)pZVar15) {
            __assert_fail("cur < ZSTD_OPT_NUM",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                          ,0x504,
                          "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                         );
          }
          goto LAB_0020d29d;
        }
      }
LAB_0020d658:
    } while (pBVar25 < local_b0);
  }
  else {
  }
  return (long)pBVar23 - (long)local_f8;
}

Assistant:

static size_t ZSTD_compressBlock_opt2(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        const void* src, size_t srcSize, const ZSTD_dictMode_e dictMode)
{
    return ZSTD_compressBlock_opt_generic(ms, seqStore, rep, src, srcSize, 2 /* optLevel */, dictMode);
}